

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall SimulationDecPOMDPDiscrete::Initialize(SimulationDecPOMDPDiscrete *this)

{
  DecPOMDPDiscreteInterface *pDVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  ostream *poVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  sVar3 = (this->_m_pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  if (sVar3 == 999999) {
    sVar3 = PlanningUnitMADPDiscrete::GetNrStates(&this->_m_pu->super_PlanningUnitMADPDiscrete);
    if (sVar3 == 0) {
      local_48._0_8_ = 0.0;
    }
    else {
      local_48 = ZEXT816(0);
      uVar9 = 0;
      do {
        lVar4 = (**(code **)((long)*(this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))()
        ;
        if (lVar4 != 0) {
          uVar10 = 1;
          do {
            pDVar1 = this->_m_pu->_m_DecPOMDP;
            auVar15._0_8_ = (**(code **)(*(long *)pDVar1 + 0xc0))(pDVar1,uVar9,uVar10 - 1);
            auVar15._8_56_ = extraout_var;
            auVar11._8_8_ = 0x7fffffffffffffff;
            auVar11._0_8_ = 0x7fffffffffffffff;
            auVar11 = vandpd_avx512vl(auVar15._0_16_,auVar11);
            if ((double)local_48._0_8_ < auVar11._0_8_) {
              pDVar1 = this->_m_pu->_m_DecPOMDP;
              auVar16._0_8_ = (**(code **)(*(long *)pDVar1 + 0xc0))(pDVar1,uVar9,uVar10 - 1);
              auVar16._8_56_ = extraout_var_00;
              auVar2._8_8_ = 0x7fffffffffffffff;
              auVar2._0_8_ = 0x7fffffffffffffff;
              local_48 = vandpd_avx512vl(auVar16._0_16_,auVar2);
            }
            uVar8 = (ulong)uVar10;
            uVar5 = (**(code **)((long)*(this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp + 0x68
                                ))();
            uVar10 = uVar10 + 1;
          } while (uVar5 != uVar8);
        }
        uVar9 = (ulong)((int)uVar9 + 1);
        sVar3 = PlanningUnitMADPDiscrete::GetNrStates(&this->_m_pu->super_PlanningUnitMADPDiscrete);
      } while (sVar3 != uVar9);
    }
    dVar12 = log(1e-06 / (double)local_48._0_8_);
    pDVar1 = this->_m_pu->_m_DecPOMDP;
    dVar13 = (double)(**(code **)(*(long *)((long)&pDVar1->field_0x0 +
                                           *(long *)(*(long *)pDVar1 + -0xb0)) + 0x70))
                               ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb0));
    dVar13 = log(dVar13);
    auVar14._0_8_ = dVar12 / dVar13;
    auVar14._8_8_ = 0;
    auVar11 = vroundsd_avx(auVar14,auVar14,10);
    sVar3 = lrint(auVar11._0_8_);
    this->_m_horizon = sVar3;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SimulationDecPOMDPDiscrete: Set horizon to ",0x2b);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (g ",4);
    pDVar1 = this->_m_pu->_m_DecPOMDP;
    dVar12 = (double)(**(code **)(*(long *)((long)&pDVar1->field_0x0 +
                                           *(long *)(*(long *)pDVar1 + -0xb0)) + 0x70))
                               ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb0));
    poVar6 = std::ostream::_M_insert<double>(dVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," max|R| ",8);
    poVar6 = std::ostream::_M_insert<double>((double)local_48._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  else {
    this->_m_horizon = sVar3;
  }
  if ((this->super_Simulation)._m_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Simulation::RunSimulations horizon ",0x23);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," nrRuns ",8);
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)poVar6,(this->super_Simulation)._m_nrRuns);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," seed ",6);
    plVar7 = (long *)std::ostream::operator<<
                               ((ostream *)poVar6,(this->super_Simulation)._m_random_seed);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
  }
  uVar10 = (this->super_Simulation)._m_random_seed;
  if (uVar10 != 0x7fffffff) {
    srand(uVar10);
    return;
  }
  return;
}

Assistant:

void SimulationDecPOMDPDiscrete::Initialize()
{
    if(_m_pu->GetHorizon()==MAXHORIZON)
    {
        // figure out until what horizon we should sample to get a
        // maximum error smaller than 1-e6
        double maxAbsReward=0;
        for(Index s=0;s!=_m_pu->GetNrStates();++s)
            for(Index ja=0;ja!=_m_pu->GetNrJointActions();++ja)
                if(abs(_m_pu->GetReward(s,ja))>maxAbsReward)
                    maxAbsReward=abs(_m_pu->GetReward(s,ja));
        
        _m_horizon=lrint(ceil((log(1e-6/maxAbsReward)/
                               log(_m_pu->GetDiscount()))));

        //if(GetVerbose()) //FAO: I think this is always useful to print...?
            cout << "SimulationDecPOMDPDiscrete: Set horizon to " << _m_horizon << " (g "
                 << _m_pu->GetDiscount() << " max|R| " << maxAbsReward
                 << ")" << endl;
    }
    else
        _m_horizon=_m_pu->GetHorizon();

    if(GetVerbose())
        cout << "Simulation::RunSimulations horizon " << _m_horizon
             << " nrRuns " << GetNrRuns() << " seed " 
             << GetRandomSeed() << endl;
    
    if(GetRandomSeed()!=illegalRandomSeed)
    {
        // Seed the random number generator
        srand(GetRandomSeed());
    }
}